

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseConst(WastParser *this,Const *const_,ConstType const_type)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  Result RVar2;
  Enum EVar3;
  uint32_t u32;
  Token token;
  Token opcode_token;
  Token local_128;
  char *local_e8;
  size_type sStack_e0;
  size_t local_d8;
  undefined8 uStack_d0;
  Token local_c8;
  Token local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  Consume(&local_88,this);
  if (0x3d < local_88.token_type_ - AtomicLoad) {
    __assert_fail("HasOpcode()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                  ,0x65,"Opcode wabt::Token::opcode() const");
  }
  GetToken(&local_c8,this);
  local_128.loc.field_1.field_1.offset = local_c8.loc.field_1.field_1.offset;
  local_128.loc.field_1._8_8_ = local_c8.loc.field_1._8_8_;
  local_128.loc.filename.data_ = local_c8.loc.filename.data_;
  local_128.loc.filename.size_ = local_c8.loc.filename.size_;
  (const_->loc).field_1.field_1.offset = (size_t)local_c8.loc.field_1.field_1.offset;
  *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_c8.loc.field_1._8_8_;
  (const_->loc).filename.data_ = local_c8.loc.filename.data_;
  (const_->loc).filename.size_ = local_c8.loc.filename.size_;
  GetToken(&local_c8,this);
  if (local_88.field_2.literal_.type == 0xd7) {
    ErrorUnlessOpcodeEnabled(this,&local_88);
    RVar2 = ParseSimdV128Const(this,const_,local_c8.token_type_,const_type);
    return (Result)(uint)(RVar2.enum_ == Error);
  }
  if ((0x31 < (ulong)local_c8.token_type_) ||
     ((0x3800018000000U >> ((ulong)local_c8.token_type_ & 0x3f) & 1) == 0)) {
    paVar1 = &local_128.loc.field_1;
    local_128.loc.filename.data_ = (char *)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"a numeric literal","");
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               &local_128,&local_128.token_type_);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_48,"123, -45, 6.7e8");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_128.loc.filename.data_ == paVar1) {
      return (Result)RVar2.enum_;
    }
    operator_delete(local_128.loc.filename.data_);
    return (Result)RVar2.enum_;
  }
  switch(local_88.field_2.literal_.type) {
  case 0x35:
    Consume(&local_128,this);
    if (2 < local_128.token_type_ - First_Literal) {
LAB_0022e14e:
      __assert_fail("HasLiteral()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x6a,"const Literal &wabt::Token::literal() const");
    }
    RVar2 = ParseInt32(local_128.field_2.literal_.text.data_,
                       local_128.field_2.literal_.text.data_ + local_128.field_2.literal_.text.size_
                       ,(uint32_t *)&local_128,SignedAndUnsigned);
    (const_->type_).enum_ = I32;
    *(undefined4 *)(const_->data_).v = local_128.loc.filename.data_._0_4_;
    break;
  case 0x36:
    Consume(&local_128,this);
    if (2 < local_128.token_type_ - First_Literal) goto LAB_0022e14e;
    RVar2 = ParseInt64(local_128.field_2.literal_.text.data_,
                       local_128.field_2.literal_.text.data_ + local_128.field_2.literal_.text.size_
                       ,(uint64_t *)&local_128,SignedAndUnsigned);
    (const_->type_).enum_ = I64;
    *(char **)(const_->data_).v = local_128.loc.filename.data_;
    break;
  case 0x37:
    RVar2 = ParseF32(this,const_,const_type);
    goto LAB_0022e02f;
  case 0x38:
    RVar2 = ParseF64(this,const_,const_type);
    goto LAB_0022e02f;
  default:
    __assert_fail("!\"ParseConst called with invalid opcode\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                  ,0x922,"Result wabt::WastParser::ParseConst(Const *, ConstType)");
  }
  const_->nan_[0] = None;
LAB_0022e02f:
  EVar3 = Ok;
  if (RVar2.enum_ == Error) {
    local_e8 = (const_->loc).filename.data_;
    sStack_e0 = (const_->loc).filename.size_;
    local_d8 = (const_->loc).field_1.field_1.offset;
    uStack_d0 = *(undefined8 *)((long)&(const_->loc).field_1 + 8);
    Token::to_string_abi_cxx11_((string *)&local_128,&local_c8);
    Error(this,0x27f044,local_128.loc.filename.data_);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_128.loc.filename.data_ !=
        &local_128.loc.field_1) {
      operator_delete(local_128.loc.filename.data_);
    }
    EVar3 = Error;
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseConst(Const* const_, ConstType const_type) {
  WABT_TRACE(ParseConst);
  Token opcode_token = Consume();
  Opcode opcode = opcode_token.opcode();
  const_->loc = GetLocation();
  Token token = GetToken();

  // V128 is fully handled by ParseSimdV128Const:
  if (opcode != Opcode::V128Const) {
    switch (token.token_type()) {
      case TokenType::Nat:
      case TokenType::Int:
      case TokenType::Float:
        // OK.
        break;
      case TokenType::NanArithmetic:
      case TokenType::NanCanonical:
        break;
      default:
        return ErrorExpected({"a numeric literal"}, "123, -45, 6.7e8");
    }
  }

  Result result;
  switch (opcode) {
    case Opcode::I32Const: {
      auto sv = Consume().literal().text;
      uint32_t u32;
      result = ParseInt32(sv.begin(), sv.end(), &u32,
                          ParseIntType::SignedAndUnsigned);
      const_->set_u32(u32);
      break;
    }

    case Opcode::I64Const: {
      auto sv = Consume().literal().text;
      uint64_t u64;
      result = ParseInt64(sv.begin(), sv.end(), &u64,
                          ParseIntType::SignedAndUnsigned);
      const_->set_u64(u64);
      break;
    }

    case Opcode::F32Const:
      result = ParseF32(const_, const_type);
      break;

    case Opcode::F64Const:
      result = ParseF64(const_, const_type);
      break;

    case Opcode::V128Const:
      ErrorUnlessOpcodeEnabled(opcode_token);
      // Parse V128 Simd Const (16 bytes).
      result = ParseSimdV128Const(const_, token.token_type(), const_type);
      // ParseSimdV128Const report error already, just return here if parser get
      // errors.
      if (Failed(result)) {
        return Result::Error;
      }
      break;

    default:
      assert(!"ParseConst called with invalid opcode");
      return Result::Error;
  }

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"%s\"", token.to_string().c_str());
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}